

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O1

void __thiscall cmCursesMainForm::HandleInput(cmCursesMainForm *this)

{
  size_type sVar1;
  cmState *pcVar2;
  cmCursesCacheEntryComposite *pcVar3;
  undefined8 __n;
  byte bVar4;
  _Bool _Var5;
  FIELD *pFVar6;
  long *plVar7;
  long lVar8;
  cmCursesLongMessageForm *pcVar9;
  char *pcVar10;
  char *pcVar11;
  size_t sVar12;
  size_t sVar13;
  char *__s;
  long *plVar14;
  FIELD **ppFVar15;
  pointer ppcVar16;
  int iVar17;
  ulong uVar18;
  FORM *pFVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar20;
  pointer ppcVar21;
  uint uVar22;
  bool bVar23;
  string searchstr;
  int key;
  char debugMessage [128];
  FIELD *local_138;
  undefined1 local_130 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  uint local_108;
  allocator local_101;
  FIELD *local_100;
  pointer local_f8;
  string local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_c8;
  string *local_c0;
  char local_b8 [136];
  
  if ((this->super_cmCursesForm).Form != (FORM *)0x0) {
    pbVar20 = &this->SearchString;
    local_c0 = (string *)&this->OldSearchString;
    local_c8 = &this->Errors;
    local_d0 = &this->HelpMessage;
    uVar22 = 0;
    local_110 = pbVar20;
    do {
      (*(this->super_cmCursesForm)._vptr_cmCursesForm[4])(this);
      PrintKeys(this,0);
      if (this->SearchMode == true) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_130,"Search: ",pbVar20);
        (*(this->super_cmCursesForm)._vptr_cmCursesForm[6])(this,local_130._0_8_);
        PrintKeys(this,1);
        move(uVar22 - 5);
        if (_stdscr == 0) {
          iVar17 = -1;
        }
        else {
          iVar17 = *(short *)(_stdscr + 4) + 1;
        }
        wtouchln(_stdscr,0,iVar17,1);
        refresh();
        if ((FIELD *)local_130._0_8_ != (FIELD *)(local_130 + 0x10)) {
          operator_delete((void *)local_130._0_8_,CONCAT71(local_130._17_7_,local_130[0x10]) + 1);
        }
      }
      local_108 = wgetch(_stdscr);
      iVar17 = -1;
      uVar22 = 0xffffffff;
      if (_stdscr != 0) {
        uVar22 = (int)*(short *)(_stdscr + 4) + 1;
        iVar17 = *(short *)(_stdscr + 6) + 1;
      }
      if ((iVar17 < 0x41) || ((int)uVar22 < 6)) {
        bVar23 = local_108 == 0x71;
        goto switchD_00228900_caseD_71;
      }
      pFVar6 = current_field((this->super_cmCursesForm).Form);
      plVar7 = (long *)field_userptr(pFVar6);
      pbVar20 = local_110;
      if (this->SearchMode == true) {
        if ((local_108 == 0x157) || (local_108 == 10)) {
          this->SearchMode = false;
          if ((this->SearchString)._M_string_length != 0) {
            JumpToCacheEntry(this,(this->SearchString)._M_dataplus._M_p);
            std::__cxx11::string::_M_assign(local_c0);
          }
          bVar4 = 0;
          std::__cxx11::string::_M_replace
                    ((ulong)pbVar20,0,(char *)(this->SearchString)._M_string_length,0x50ea83);
        }
        else {
          if (((local_108 & 0xffffffdf) - 0x41 < 0x1a) ||
             (local_108 == 0x5f || local_108 - 0x30 < 10)) {
            if ((this->SearchString)._M_string_length < (ulong)(iVar17 - 10)) {
              std::__cxx11::string::push_back((char)local_110);
            }
          }
          else if ((((local_108 == 8) || (local_108 == 0x14a)) || (local_108 == 0x107)) &&
                  (sVar1 = (this->SearchString)._M_string_length, sVar1 != 0)) {
            bVar4 = 0;
            std::__cxx11::string::resize((ulong)local_110,(char)sVar1 + -1);
            goto LAB_00228889;
          }
LAB_00228887:
          bVar4 = 0;
        }
      }
      else {
        if (plVar7 == (long *)0x0) goto LAB_00228887;
        bVar4 = (**(code **)(*plVar7 + 0x10))(plVar7,&local_108,this,_stdscr);
        if (bVar4 != 0) {
          this->OkToGenerate = false;
          (*(this->super_cmCursesForm)._vptr_cmCursesForm[4])(this);
          PrintKeys(this,0);
        }
      }
LAB_00228889:
      if (((plVar7 != (long *)0x0 & bVar4) != 0) || (this->SearchMode != false))
      goto switchD_00228900_caseD_65;
      sprintf(local_b8,"Main form handling input, key: %d",(ulong)local_108);
      cmCursesForm::LogMessage(local_b8);
      pbVar20 = local_110;
      if ((int)local_108 < 99) {
        if ((int)local_108 < 0x10) {
          if (local_108 == 4) {
LAB_00228a8e:
            pFVar19 = (this->super_cmCursesForm).Form;
            iVar17 = 0x200;
LAB_00228d4d:
            form_driver(pFVar19,iVar17);
          }
          else if (local_108 == 0xe) goto LAB_00228a3d;
        }
        else if (local_108 == 0x10) {
LAB_00228993:
          pFVar6 = current_field((this->super_cmCursesForm).Form);
          iVar17 = field_index(pFVar6);
          if (iVar17 == 2) {
LAB_00228a67:
            bVar23 = false;
            goto switchD_00228900_caseD_71;
          }
          _Var5 = new_page(this->Fields[(long)iVar17 + -2]);
          pFVar19 = (this->super_cmCursesForm).Form;
          if (_Var5) {
            form_driver(pFVar19,0x201);
            set_current_field((this->super_cmCursesForm).Form,this->Fields[(long)iVar17 + -3]);
          }
          else {
            form_driver(pFVar19,0x205);
          }
          if (iVar17 == 2) {
            bVar23 = false;
            pbVar20 = local_110;
            goto switchD_00228900_caseD_71;
          }
        }
        else {
          if (local_108 == 0x15) {
LAB_00228a80:
            pFVar19 = (this->super_cmCursesForm).Form;
            iVar17 = 0x201;
            goto LAB_00228d4d;
          }
          if (local_108 == 0x2f) {
            this->SearchMode = true;
            (*(this->super_cmCursesForm)._vptr_cmCursesForm[6])(this,"Search");
            PrintKeys(this,1);
            if (_stdscr == 0) {
              iVar17 = -1;
            }
            else {
              iVar17 = *(short *)(_stdscr + 4) + 1;
            }
            wtouchln(_stdscr,0,iVar17,1);
            refresh();
          }
        }
        goto switchD_00228900_caseD_65;
      }
      if (0x101 < (int)local_108) {
        if ((int)local_108 < 0x152) {
          if (local_108 == 0x102) {
LAB_00228a3d:
            pFVar6 = current_field((this->super_cmCursesForm).Form);
            iVar17 = field_index(pFVar6);
            if (this->NumberOfVisibleEntries * 3 + -1 != (long)iVar17) {
              _Var5 = new_page(this->Fields[(long)iVar17 + 1]);
              pFVar19 = (this->super_cmCursesForm).Form;
              iVar17 = (uint)!_Var5 * 4 + 0x200;
              goto LAB_00228d4d;
            }
            goto LAB_00228a67;
          }
          if (local_108 == 0x103) goto LAB_00228993;
        }
        else {
          if (local_108 == 0x152) goto LAB_00228a8e;
          if (local_108 == 0x153) goto LAB_00228a80;
        }
        goto switchD_00228900_caseD_65;
      }
      bVar23 = true;
      switch(local_108) {
      case 99:
        Configure(this,0);
        break;
      case 100:
        if (this->NumberOfVisibleEntries != 0) {
          this->OkToGenerate = false;
          pFVar6 = current_field((this->super_cmCursesForm).Form);
          iVar17 = field_index(pFVar6);
          lVar8 = (long)iVar17;
          if (iVar17 == 2) {
            local_138 = (FIELD *)0x0;
          }
          else {
            ppFVar15 = this->Fields + -5;
            if (this->NumberOfVisibleEntries * 3 + -1 != lVar8) {
              ppFVar15 = this->Fields + 1;
            }
            local_138 = ppFVar15[lVar8];
          }
          plVar7 = (long *)field_userptr(this->Fields[lVar8 + -2]);
          if (plVar7 != (long *)0x0) {
            pcVar2 = this->CMakeInstance->State;
            pcVar10 = (char *)(**(code **)(*plVar7 + 0x28))(plVar7);
            std::__cxx11::string::string((string *)local_130,pcVar10,(allocator *)&local_f0);
            cmState::RemoveCacheEntry(pcVar2,(string *)local_130);
            if ((FIELD *)local_130._0_8_ != (FIELD *)(local_130 + 0x10)) {
              operator_delete((void *)local_130._0_8_,CONCAT71(local_130._17_7_,local_130[0x10]) + 1
                             );
            }
            local_130._0_8_ = local_130 + 0x10;
            local_130._8_8_ = 0;
            local_130[0x10] = '\0';
            if (local_138 != (FIELD *)0x0) {
              plVar14 = (long *)field_userptr(local_138);
              pcVar10 = (char *)(**(code **)(*plVar14 + 0x28))(plVar14);
              std::__cxx11::string::operator=((string *)local_130,pcVar10);
            }
            uVar18 = 0xffffffff;
            uVar22 = 0xffffffff;
            if (_stdscr != 0) {
              uVar22 = (int)*(short *)(_stdscr + 4) + 1;
              uVar18 = (ulong)((int)*(short *)(_stdscr + 6) + 1);
            }
            pcVar10 = (char *)(**(code **)(*plVar7 + 0x28))(plVar7);
            RemoveEntry(this,pcVar10);
            RePost(this);
            (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])(this,1,1,uVar18,(ulong)uVar22);
            __n = local_130._8_8_;
            if (local_138 != (FIELD *)0x0) {
              ppcVar21 = (this->Entries->
                         super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                         )._M_impl.super__Vector_impl_data._M_start;
              ppcVar16 = (this->Entries->
                         super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              if (ppcVar21 == ppcVar16) {
                local_138 = (FIELD *)0x0;
              }
              else {
                local_100 = (FIELD *)local_130._0_8_;
                local_138 = (FIELD *)0x0;
                local_f8 = ppcVar16;
                do {
                  pcVar3 = *ppcVar21;
                  if ((__n == (pcVar3->Key)._M_string_length) &&
                     ((__n == 0 ||
                      (iVar17 = bcmp(local_100,(pcVar3->Key)._M_dataplus._M_p,__n),
                      ppcVar16 = local_f8, iVar17 == 0)))) {
                    local_138 = pcVar3->Entry->Field;
                  }
                  ppcVar21 = ppcVar21 + 1;
                } while (ppcVar21 != ppcVar16);
              }
              if (local_138 != (FIELD *)0x0) {
                set_current_field((this->super_cmCursesForm).Form,local_138);
              }
            }
            if ((FIELD *)local_130._0_8_ != (FIELD *)(local_130 + 0x10)) {
              operator_delete((void *)local_130._0_8_,CONCAT71(local_130._17_7_,local_130[0x10]) + 1
                             );
            }
          }
        }
        break;
      case 0x67:
        if (this->OkToGenerate != true) break;
        Generate(this);
        goto switchD_00228900_caseD_71;
      case 0x68:
        iVar17 = -1;
        uVar22 = 0xffffffff;
        if (_stdscr != 0) {
          uVar22 = (int)*(short *)(_stdscr + 4) + 1;
        }
        if (_stdscr != 0) {
          iVar17 = *(short *)(_stdscr + 6) + 1;
        }
        local_f8 = (pointer)CONCAT44(local_f8._4_4_,iVar17);
        local_100 = current_field((this->super_cmCursesForm).Form);
        iVar17 = field_index(local_100);
        plVar7 = (long *)field_userptr(this->Fields[(long)iVar17 + -2]);
        pcVar10 = (char *)(**(code **)(*plVar7 + 0x28))(plVar7);
        pcVar2 = this->CMakeInstance->State;
        std::__cxx11::string::string((string *)local_130,pcVar10,(allocator *)&local_f0);
        pcVar11 = cmState::GetCacheEntryValue(pcVar2,(string *)local_130);
        if ((FIELD *)local_130._0_8_ != (FIELD *)(local_130 + 0x10)) {
          operator_delete((void *)local_130._0_8_,CONCAT71(local_130._17_7_,local_130[0x10]) + 1);
        }
        if (pcVar11 == (char *)0x0) {
          pcVar11 = (char *)0x0;
        }
        else {
          pcVar2 = this->CMakeInstance->State;
          std::__cxx11::string::string((string *)local_130,pcVar10,&local_101);
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"HELPSTRING","");
          pcVar11 = cmState::GetCacheEntryProperty(pcVar2,(string *)local_130,&local_f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          if ((FIELD *)local_130._0_8_ != (FIELD *)(local_130 + 0x10)) {
            operator_delete((void *)local_130._0_8_,CONCAT71(local_130._17_7_,local_130[0x10]) + 1);
          }
        }
        if (pcVar11 == (char *)0x0) {
          std::__cxx11::string::operator=
                    ((string *)
                     ((this->HelpMessage).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1),"");
        }
        else {
          sVar12 = strlen(pcVar10);
          sVar13 = strlen(pcVar11);
          __s = (char *)operator_new__(sVar13 + sVar12 + 0x40);
          sprintf(__s,"Current option is: %s\nHelp string for this option is: %s\n",pcVar10,pcVar11)
          ;
          std::__cxx11::string::operator=
                    ((string *)
                     ((this->HelpMessage).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1),__s);
          operator_delete__(__s);
        }
        pcVar9 = (cmCursesLongMessageForm *)operator_new(0x60);
        cmCursesLongMessageForm::cmCursesLongMessageForm(pcVar9,local_d0,"Help.");
        ppcVar21 = local_f8;
        cmCursesForm::CurrentForm = (cmCursesForm *)pcVar9;
        (*(pcVar9->super_cmCursesForm)._vptr_cmCursesForm[3])
                  (pcVar9,1,1,(ulong)local_f8 & 0xffffffff,(ulong)uVar22);
        (*(pcVar9->super_cmCursesForm)._vptr_cmCursesForm[2])(pcVar9);
        cmCursesForm::CurrentForm = &this->super_cmCursesForm;
        (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])
                  (this,1,1,(ulong)ppcVar21 & 0xffffffff,(ulong)uVar22);
        set_current_field((this->super_cmCursesForm).Form,local_100);
        break;
      case 0x6c:
        uVar18 = 0xffffffff;
        uVar22 = 0xffffffff;
        if (_stdscr != 0) {
          uVar22 = (int)*(short *)(_stdscr + 4) + 1;
          uVar18 = (ulong)((int)*(short *)(_stdscr + 6) + 1);
        }
        pcVar9 = (cmCursesLongMessageForm *)operator_new(0x60);
        cmCursesLongMessageForm::cmCursesLongMessageForm
                  (pcVar9,local_c8,"Errors occurred during the last pass.");
        cmCursesForm::CurrentForm = (cmCursesForm *)pcVar9;
        (*(pcVar9->super_cmCursesForm)._vptr_cmCursesForm[3])(pcVar9,1,1,uVar18,(ulong)uVar22);
        (*(pcVar9->super_cmCursesForm)._vptr_cmCursesForm[2])(pcVar9);
        cmCursesForm::CurrentForm = &this->super_cmCursesForm;
        goto LAB_00228cfa;
      case 0x6e:
        if ((this->OldSearchString)._M_string_length != 0) {
          JumpToCacheEntry(this,(this->OldSearchString)._M_dataplus._M_p);
        }
        break;
      case 0x71:
        goto switchD_00228900_caseD_71;
      case 0x74:
        this->AdvancedMode = (bool)(this->AdvancedMode ^ 1);
        uVar18 = 0xffffffff;
        uVar22 = 0xffffffff;
        if (_stdscr != 0) {
          uVar22 = (int)*(short *)(_stdscr + 4) + 1;
          uVar18 = (ulong)((int)*(short *)(_stdscr + 6) + 1);
        }
        RePost(this);
LAB_00228cfa:
        (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])(this,1,1,uVar18,(ulong)uVar22);
      }
switchD_00228900_caseD_65:
      pbVar20 = local_110;
      if (_stdscr == 0) {
        iVar17 = -1;
      }
      else {
        iVar17 = *(short *)(_stdscr + 4) + 1;
      }
      bVar23 = false;
      wtouchln(_stdscr,0,iVar17,1);
      wrefresh(_stdscr);
switchD_00228900_caseD_71:
    } while (!bVar23);
  }
  return;
}

Assistant:

void cmCursesMainForm::HandleInput()
{
  int x=0,y=0;

  if (!this->Form)
    {
    return;
    }

  FIELD* currentField;
  cmCursesWidget* currentWidget;

  char debugMessage[128];

  for(;;)
    {
    this->UpdateStatusBar();
    this->PrintKeys();
    if ( this->SearchMode )
      {
      std::string searchstr = "Search: " + this->SearchString;
      this->UpdateStatusBar( searchstr.c_str() );
      this->PrintKeys(1);
      curses_move(y-5,static_cast<unsigned int>(searchstr.size()));
      //curses_move(1,1);
      touchwin(stdscr);
      refresh();
      }
    int key = getch();

    getmaxyx(stdscr, y, x);
    // If window too small, handle 'q' only
    if ( x < cmCursesMainForm::MIN_WIDTH  ||
         y < cmCursesMainForm::MIN_HEIGHT )
      {
      // quit
      if ( key == 'q' )
        {
        break;
        }
      else
        {
        continue;
        }
      }

    currentField = current_field(this->Form);
    currentWidget = reinterpret_cast<cmCursesWidget*>(field_userptr(
      currentField));

    bool widgetHandled=false;

    if ( this->SearchMode )
      {
      if ( key == 10 || key == KEY_ENTER )
        {
        this->SearchMode = false;
        if (!this->SearchString.empty())
          {
          this->JumpToCacheEntry(this->SearchString.c_str());
          this->OldSearchString = this->SearchString;
          }
        this->SearchString = "";
        }
      /*
      else if ( key == KEY_ESCAPE )
        {
        this->SearchMode = false;
        }
      */
      else if ((key >= 'a' && key <= 'z') ||
               (key >= 'A' && key <= 'Z') ||
               (key >= '0' && key <= '9') ||
               (key == '_' ))
        {
        if ( this->SearchString.size() < static_cast<std::string::size_type>(x-10) )
          {
          this->SearchString += static_cast<char>(key);
          }
        }
      else if ( key == ctrl('h') || key == KEY_BACKSPACE || key == KEY_DC )
        {
        if (!this->SearchString.empty())
          {
          this->SearchString.resize(this->SearchString.size()-1);
          }
        }
      }
    else if (currentWidget && !this->SearchMode)
      {
      // Ask the current widget if it wants to handle input
      widgetHandled = currentWidget->HandleInput(key, this, stdscr);
      if (widgetHandled)
        {
        this->OkToGenerate = false;
        this->UpdateStatusBar();
        this->PrintKeys();
        }
      }
    if ((!currentWidget || !widgetHandled) && !this->SearchMode)
      {
      // If the current widget does not want to handle input,
      // we handle it.
      sprintf(debugMessage, "Main form handling input, key: %d", key);
      cmCursesForm::LogMessage(debugMessage);
      // quit
      if ( key == 'q' )
        {
        break;
        }
      // if not end of page, next field otherwise next page
      // each entry consists of fields: label, isnew, value
      // therefore, the label field for the prev. entry is index-5
      // and the label field for the next entry is index+1
      // (index always corresponds to the value field)
      else if ( key == KEY_DOWN || key == ctrl('n') )
        {
        FIELD* cur = current_field(this->Form);
        size_t findex = field_index(cur);
        if ( findex == 3*this->NumberOfVisibleEntries-1 )
          {
          continue;
          }
        if (new_page(this->Fields[findex+1]))
          {
          form_driver(this->Form, REQ_NEXT_PAGE);
          }
        else
          {
          form_driver(this->Form, REQ_NEXT_FIELD);
          }
        }
      // if not beginning of page, previous field, otherwise previous page
      // each entry consists of fields: label, isnew, value
      // therefore, the label field for the prev. entry is index-5
      // and the label field for the next entry is index+1
      // (index always corresponds to the value field)
      else if ( key == KEY_UP || key == ctrl('p') )
        {
        FIELD* cur = current_field(this->Form);
        int findex = field_index(cur);
        if ( findex == 2 )
          {
          continue;
          }
        if ( new_page(this->Fields[findex-2]) )
          {
          form_driver(this->Form, REQ_PREV_PAGE);
          set_current_field(this->Form, this->Fields[findex-3]);
          }
        else
          {
          form_driver(this->Form, REQ_PREV_FIELD);
          }
        }
      // pg down
      else if ( key == KEY_NPAGE || key == ctrl('d') )
        {
        form_driver(this->Form, REQ_NEXT_PAGE);
        }
      // pg up
      else if ( key == KEY_PPAGE || key == ctrl('u') )
        {
        form_driver(this->Form, REQ_PREV_PAGE);
        }
      // configure
      else if ( key == 'c' )
        {
        this->Configure();
        }
      // display help
      else if ( key == 'h' )
        {
        getmaxyx(stdscr, y, x);

        FIELD* cur = current_field(this->Form);
        int findex = field_index(cur);
        cmCursesWidget* lbl = reinterpret_cast<cmCursesWidget*>(field_userptr(
          this->Fields[findex-2]));
        const char* curField = lbl->GetValue();
        const char* helpString = 0;

        const char* existingValue =
            this->CMakeInstance->GetState()
                ->GetCacheEntryValue(curField);
        if (existingValue)
          {
          helpString = this->CMakeInstance->GetState()
                           ->GetCacheEntryProperty(curField, "HELPSTRING");
          }
        if (helpString)
          {
          char* message = new char[strlen(curField)+strlen(helpString)
                                  +strlen("Current option is: \n Help string for this option is: \n")+10];
          sprintf(message,"Current option is: %s\nHelp string for this option is: %s\n", curField, helpString);
          this->HelpMessage[1] = message;
          delete[] message;
          }
        else
          {
          this->HelpMessage[1] = "";
          }

        cmCursesLongMessageForm* msgs = new cmCursesLongMessageForm(this->HelpMessage,
                                                                    "Help.");
        CurrentForm = msgs;
        msgs->Render(1,1,x,y);
        msgs->HandleInput();
        CurrentForm = this;
        this->Render(1,1,x,y);
        set_current_field(this->Form, cur);
        }
      // display last errors
      else if ( key == 'l' )
        {
        getmaxyx(stdscr, y, x);
        cmCursesLongMessageForm* msgs = new cmCursesLongMessageForm(this->Errors,
                                                                    "Errors occurred during the last pass.");
        CurrentForm = msgs;
        msgs->Render(1,1,x,y);
        msgs->HandleInput();
        CurrentForm = this;
        this->Render(1,1,x,y);
        }
      else if ( key == '/' )
        {
        this->SearchMode = true;
        this->UpdateStatusBar("Search");
        this->PrintKeys(1);
        touchwin(stdscr);
        refresh();
        }
      else if ( key == 'n' )
        {
        if (!this->OldSearchString.empty())
          {
          this->JumpToCacheEntry(this->OldSearchString.c_str());
          }
        }
      // switch advanced on/off
      else if ( key == 't' )
        {
        if (this->AdvancedMode)
          {
          this->AdvancedMode = false;
          }
        else
          {
          this->AdvancedMode = true;
          }
        getmaxyx(stdscr, y, x);
        this->RePost();
        this->Render(1, 1, x, y);
        }
      // generate and exit
      else if ( key == 'g' )
        {
        if ( this->OkToGenerate )
          {
          this->Generate();
          break;
          }
        }
      // delete cache entry
      else if ( key == 'd' && this->NumberOfVisibleEntries )
        {
        this->OkToGenerate = false;
        FIELD* cur = current_field(this->Form);
        size_t findex = field_index(cur);

        // make the next or prev. current field after deletion
        // each entry consists of fields: label, isnew, value
        // therefore, the label field for the prev. entry is findex-5
        // and the label field for the next entry is findex+1
        // (findex always corresponds to the value field)
        FIELD* nextCur;
        if ( findex == 2 )
          {
          nextCur=0;
          }
        else if ( findex == 3*this->NumberOfVisibleEntries-1 )
          {
          nextCur = this->Fields[findex-5];
          }
        else
          {
          nextCur = this->Fields[findex+1];
          }

        // Get the label widget
        // each entry consists of fields: label, isnew, value
        // therefore, the label field for the is findex-2
        // (findex always corresponds to the value field)
        cmCursesWidget* lbl
          = reinterpret_cast<cmCursesWidget*>(
            field_userptr(this->Fields[findex-2]));
        if ( lbl )
          {
          this->CMakeInstance->GetState()->RemoveCacheEntry(lbl->GetValue());

          std::string nextVal;
          if (nextCur)
            {
            nextVal = (reinterpret_cast<cmCursesWidget*>(field_userptr(nextCur))->GetValue());
            }

          getmaxyx(stdscr, y, x);
          this->RemoveEntry(lbl->GetValue());
          this->RePost();
          this->Render(1, 1, x, y);

          if (nextCur)
            {
            // make the next or prev. current field after deletion
            nextCur = 0;
            std::vector<cmCursesCacheEntryComposite*>::iterator it;
            for (it = this->Entries->begin(); it != this->Entries->end(); ++it)
              {
              if (nextVal == (*it)->Key)
                {
                nextCur = (*it)->Entry->Field;
                }
              }

            if (nextCur)
              {
              set_current_field(this->Form, nextCur);
              }
            }
          }
        }
      }

    touchwin(stdscr);
    wrefresh(stdscr);
    }
}